

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLDefectsTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test::
TestBody(OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test *this)

{
  Context **__s;
  bool bVar1;
  size_t len;
  char *message;
  char *in_R9;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_;
  bool ok;
  undefined1 local_1f0 [8];
  OpenDDLParser myParser;
  char token [380];
  OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test *this_local;
  
  __s = &myParser.m_context;
  memcpy(__s,
         "Material $material1\n{\n    Name { string { \"defaultMat\" } }\n\n    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n    Param( attrib = \"specular_power\" ) { float { 50 } }\n\n    Texture( attrib = \"diffuse\" )\n    {\n        string { \"//f/kittylow.bmp\" }\n    }\n}\n"
         ,0x17c);
  OpenDDLParser::OpenDDLParser((OpenDDLParser *)local_1f0);
  len = strlen((char *)__s);
  OpenDDLParser::setBuffer((OpenDDLParser *)local_1f0,(char *)__s,len);
  gtest_ar_.message_.ptr_._3_1_ = OpenDDLParser::parse((OpenDDLParser *)local_1f0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_210,(bool)gtest_ar_.message_.ptr_._3_1_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_210,(AssertionResult *)"ok","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLDefectsTest.cpp"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  OpenDDLParser::~OpenDDLParser((OpenDDLParser *)local_1f0);
  return;
}

Assistant:

TEST_F( OpenDDLDefectsTest, strings_with_the_comment_syntax_in_them_breaks_the_parser ) {
    char token[] = {
        "Material $material1\n"
        "{\n"
        "    Name { string { \"defaultMat\" } }\n"
        "\n"
        "    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n"
        "    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n"
        "    Param( attrib = \"specular_power\" ) { float { 50 } }\n"
        "\n"
        "    Texture( attrib = \"diffuse\" )\n"
        "    {\n"
        "        string { \"//f/kittylow.bmp\" }\n"
        "    }\n"
        "}\n"
    };

    OpenDDLParser myParser;
    myParser.setBuffer( token, strlen( token ) );
    const bool ok( myParser.parse() );
    EXPECT_TRUE( ok );

}